

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  undefined1 uVar1;
  undefined4 uVar2;
  long lVar3;
  undefined8 uVar4;
  CppType CVar5;
  iterator iVar6;
  LogMessage *pLVar7;
  LogFinisher local_5d;
  int number_local;
  LogMessage local_58;
  
  number_local = number;
  iVar6 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if ((_Rb_tree_header *)iVar6._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x27b);
    pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: iter != extensions_.end(): ");
    pLVar7 = LogMessage::operator<<(pLVar7,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_5d,pLVar7);
    LogMessage::~LogMessage(&local_58);
  }
  if (*(char *)((long)&iVar6._M_node[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x27e);
    pLVar7 = LogMessage::operator<<(&local_58,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_5d,pLVar7);
    LogMessage::~LogMessage(&local_58);
  }
  CVar5 = anon_unknown_0::cpp_type(*(FieldType *)&iVar6._M_node[1]._M_left);
  switch(CVar5) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
  case CPPTYPE_ENUM:
    lVar3 = *(long *)iVar6._M_node[1]._M_parent;
    uVar2 = *(undefined4 *)(lVar3 + (long)index1 * 4);
    *(undefined4 *)(lVar3 + (long)index1 * 4) = *(undefined4 *)(lVar3 + (long)index2 * 4);
    *(undefined4 *)(lVar3 + (long)index2 * 4) = uVar2;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
  case CPPTYPE_STRING:
  case CPPTYPE_MESSAGE:
    lVar3 = *(long *)iVar6._M_node[1]._M_parent;
    uVar4 = *(undefined8 *)(lVar3 + (long)index1 * 8);
    *(undefined8 *)(lVar3 + (long)index1 * 8) = *(undefined8 *)(lVar3 + (long)index2 * 8);
    *(undefined8 *)(lVar3 + (long)index2 * 8) = uVar4;
    break;
  case CPPTYPE_DOUBLE:
    lVar3 = *(long *)iVar6._M_node[1]._M_parent;
    uVar4 = *(undefined8 *)(lVar3 + (long)index1 * 8);
    *(undefined8 *)(lVar3 + (long)index1 * 8) = *(undefined8 *)(lVar3 + (long)index2 * 8);
    *(undefined8 *)(lVar3 + (long)index2 * 8) = uVar4;
    break;
  case CPPTYPE_FLOAT:
    lVar3 = *(long *)iVar6._M_node[1]._M_parent;
    uVar2 = *(undefined4 *)(lVar3 + (long)index1 * 4);
    *(undefined4 *)(lVar3 + (long)index1 * 4) = *(undefined4 *)(lVar3 + (long)index2 * 4);
    *(undefined4 *)(lVar3 + (long)index2 * 4) = uVar2;
    break;
  case CPPTYPE_BOOL:
    lVar3 = *(long *)iVar6._M_node[1]._M_parent;
    uVar1 = *(undefined1 *)(lVar3 + index1);
    *(undefined1 *)(lVar3 + index1) = *(undefined1 *)(lVar3 + index2);
    *(undefined1 *)(lVar3 + index2) = uVar1;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}